

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-canvas.c
# Opt level: O1

float plutovg_canvas_text_extents
                (plutovg_canvas_t *canvas,void *text,int length,plutovg_text_encoding_t encoding,
                plutovg_rect_t *extents)

{
  float size;
  ushort uVar1;
  plutovg_font_face_t *face;
  plutovg_codepoint_t codepoint;
  glyph_t *pgVar2;
  plutovg_rect_t *ppVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fStack_60;
  float fStack_5c;
  plutovg_rect_t pStack_58;
  plutovg_text_iterator_t pStack_48;
  
  face = canvas->state->font_face;
  if ((face != (plutovg_font_face_t *)0x0) && (size = canvas->state->font_size, 0.0 < size)) {
    plutovg_text_iterator_init(&pStack_48,text,length,encoding);
    if (pStack_48.index < pStack_48.length) {
      fVar5 = 0.0;
      ppVar3 = (plutovg_rect_t *)0x0;
      do {
        codepoint = plutovg_text_iterator_next(&pStack_48);
        if (extents == (plutovg_rect_t *)0x0) {
          uVar1 = *(ushort *)((face->info).data + (long)(face->info).head + 0x12);
          fStack_5c = size / (float)(ushort)(uVar1 << 8 | uVar1 >> 8);
          pgVar2 = plutovg_font_face_get_glyph(face,codepoint);
          fStack_60 = (float)pgVar2->advance_width * fStack_5c;
        }
        else {
          plutovg_font_face_get_glyph_metrics
                    (face,size,codepoint,&fStack_60,(float *)0x0,&pStack_58);
          pStack_58.x = pStack_58.x + fVar5;
          if (ppVar3 == (plutovg_rect_t *)0x0) {
            extents->x = pStack_58.x;
            extents->y = pStack_58.y;
            extents->w = pStack_58.w;
            extents->h = pStack_58.h;
            ppVar3 = extents;
          }
          else {
            fVar6 = ppVar3->x;
            fVar7 = ppVar3->y;
            fVar8 = fVar6;
            if (pStack_58.x <= fVar6) {
              fVar8 = pStack_58.x;
            }
            fVar9 = fVar7;
            if (pStack_58.y <= fVar7) {
              fVar9 = pStack_58.y;
            }
            fVar6 = fVar6 + ppVar3->w;
            fVar7 = fVar7 + ppVar3->h;
            if (fVar6 <= pStack_58.x + pStack_58.w) {
              fVar6 = pStack_58.x + pStack_58.w;
            }
            if (fVar7 <= pStack_58.y + pStack_58.h) {
              fVar7 = pStack_58.y + pStack_58.h;
            }
            ppVar3->x = fVar8;
            ppVar3->y = fVar9;
            ppVar3->w = fVar6 - fVar8;
            ppVar3->h = fVar7 - fVar9;
          }
        }
        fVar5 = fVar5 + fStack_60;
      } while (pStack_48.index < pStack_48.length);
      bVar4 = ppVar3 != (plutovg_rect_t *)0x0;
    }
    else {
      fVar5 = 0.0;
      bVar4 = false;
    }
    if (extents != (plutovg_rect_t *)0x0 && !bVar4) {
      extents->x = 0.0;
      extents->y = 0.0;
      extents->w = 0.0;
      extents->h = 0.0;
    }
    return fVar5;
  }
  if (extents != (plutovg_rect_t *)0x0) {
    extents->x = 0.0;
    extents->y = 0.0;
    extents->w = 0.0;
    extents->h = 0.0;
  }
  return 0.0;
}

Assistant:

float plutovg_canvas_text_extents(plutovg_canvas_t* canvas, const void* text, int length, plutovg_text_encoding_t encoding, plutovg_rect_t* extents)
{
    plutovg_state_t* state = canvas->state;
    if(state->font_face && state->font_size > 0.f) {
        return plutovg_font_face_text_extents(state->font_face, state->font_size, text, length, encoding, extents);
    }

    if(extents) {
        extents->x = 0.f;
        extents->y = 0.f;
        extents->w = 0.f;
        extents->h = 0.f;
    }

    return 0.f;
}